

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

size_t __thiscall
google::protobuf::compiler::CodeGeneratorResponse::ByteSizeLong(CodeGeneratorResponse *this)

{
  long lVar1;
  uint uVar2;
  Rep *pRVar3;
  size_t sVar4;
  ulong uVar5;
  size_t sVar6;
  long lVar7;
  void **ppvVar8;
  
  sVar6 = (size_t)(this->file_).super_RepeatedPtrFieldBase.current_size_;
  pRVar3 = (this->file_).super_RepeatedPtrFieldBase.rep_;
  ppvVar8 = pRVar3->elements;
  if (pRVar3 == (Rep *)0x0) {
    ppvVar8 = (void **)0x0;
  }
  lVar1 = sVar6 * 8;
  for (lVar7 = 0; lVar1 - lVar7 != 0; lVar7 = lVar7 + 8) {
    sVar4 = internal::WireFormatLite::
            MessageSize<google::protobuf::compiler::CodeGeneratorResponse_File>
                      (*(CodeGeneratorResponse_File **)((long)ppvVar8 + lVar7));
    sVar6 = sVar6 + sVar4;
  }
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 3) != 0) {
    if ((uVar2 & 1) != 0) {
      sVar4 = internal::WireFormatLite::StringSize
                        ((string *)((ulong)(this->error_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      sVar6 = sVar6 + sVar4 + 1;
    }
    if ((uVar2 & 2) != 0) {
      uVar5 = this->supported_features_ | 1;
      lVar1 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      sVar6 = sVar6 + ((int)lVar1 * 9 + 0x89U >> 6);
    }
  }
  sVar6 = Message::MaybeComputeUnknownFieldsSize(&this->super_Message,sVar6,&this->_cached_size_);
  return sVar6;
}

Assistant:

size_t CodeGeneratorResponse::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.compiler.CodeGeneratorResponse)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.compiler.CodeGeneratorResponse.File file = 15;
  total_size += 1UL * this->_internal_file_size();
  for (const auto& msg : this->file_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    // optional string error = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_error());
    }

    // optional uint64 supported_features = 2;
    if (cached_has_bits & 0x00000002u) {
      total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64SizePlusOne(this->_internal_supported_features());
    }

  }
  return MaybeComputeUnknownFieldsSize(total_size, &_cached_size_);
}